

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderRendering.cpp
# Opt level: O3

string * __thiscall
glcts::GeometryShaderRenderingPointsCase::getFragmentShaderCode_abi_cxx11_
          (string *__return_storage_ptr__,GeometryShaderRenderingPointsCase *this)

{
  int iVar1;
  
  if (getFragmentShaderCode[abi:cxx11]()::fs_code_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&getFragmentShaderCode[abi:cxx11]()::fs_code_abi_cxx11_);
    if (iVar1 != 0) {
      getFragmentShaderCode[abi:cxx11]()::fs_code_abi_cxx11_._M_dataplus._M_p =
           (pointer)&getFragmentShaderCode[abi:cxx11]()::fs_code_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&getFragmentShaderCode[abi:cxx11]()::fs_code_abi_cxx11_,
                 "${VERSION}\n\nprecision highp float;\n\nin  vec4 gs_fs_color;\nout vec4 result;\n\nvoid main()\n{\n    result = gs_fs_color;\n}\n"
                 ,"");
      __cxa_atexit(std::__cxx11::string::~string,
                   &getFragmentShaderCode[abi:cxx11]()::fs_code_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&getFragmentShaderCode[abi:cxx11]()::fs_code_abi_cxx11_);
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,
             getFragmentShaderCode[abi:cxx11]()::fs_code_abi_cxx11_._M_dataplus._M_p,
             getFragmentShaderCode[abi:cxx11]()::fs_code_abi_cxx11_._M_dataplus._M_p +
             getFragmentShaderCode[abi:cxx11]()::fs_code_abi_cxx11_._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string GeometryShaderRenderingPointsCase::getFragmentShaderCode()
{
	static std::string fs_code = "${VERSION}\n"
								 "\n"
								 "precision highp float;\n"
								 "\n"
								 "in  vec4 gs_fs_color;\n"
								 "out vec4 result;\n"
								 "\n"
								 "void main()\n"
								 "{\n"
								 "    result = gs_fs_color;\n"
								 "}\n";

	return fs_code;
}